

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCStress.cpp
# Opt level: O0

void SimpleRecyclerTest(void)

{
  BackgroundPageQueue *this;
  HeapAllocator *alloc;
  Recycler *this_00;
  Location LVar1;
  Location value;
  Location value_00;
  Location value_01;
  uint local_488;
  uint uStack_484;
  OutOfMemoryException anon_var_0;
  uint i_4;
  uint i_3;
  uint local_45c;
  uint i_2;
  uint local_434;
  uint i_1;
  uint local_40c;
  uint i;
  RecyclerTestObject *stackRoots [50];
  TrackAllocData local_250;
  AutoNestedHandledExceptionType local_228 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 local_218 [8];
  IdleDecommitPageAllocator pageAllocator;
  BackgroundPageQueue backgroundPageQueue;
  
  BuildObjectCreationTable();
  BuildOperationTable();
  this = (BackgroundPageQueue *)(pageAllocator.cs.super_CCLock.mutexPtr + 0x38);
  Memory::
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::BackgroundPageQueue::BackgroundPageQueue(this);
  Memory::IdleDecommitPageAllocator::IdleDecommitPageAllocator
            ((IdleDecommitPageAllocator *)local_218,(AllocationPolicyManager *)0x0,
             PageAllocatorType_Thread,(ConfigFlagsTable *)Js::Configuration::Global,0,0x400,false,
             this,0x20,false);
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_228,ExceptionType_DisableCheck);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_250,(type_info *)&Memory::Recycler::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/GCStress/GCStress.cpp"
             ,0x114);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_250);
  this_00 = (Recycler *)new<Memory::HeapAllocator>(0x166e0,alloc,0x217090);
  Memory::Recycler::Recycler
            (this_00,(AllocationPolicyManager *)0x0,(IdleDecommitPageAllocator *)local_218,
             Js::Throw::OutOfMemory,(ConfigFlagsTable *)Js::Configuration::Global,
             (RecyclerTelemetryHostInterface *)0x0);
  recyclerInstance = this_00;
  Memory::Recycler::Initialize(this_00,false,(ThreadService *)0x0,false,PageHeapModeOff,false,false)
  ;
  PAL_wprintf(L"Recycler created, initializing heap...\n");
  for (local_40c = 0; local_40c < 0x32; local_40c = local_40c + 1) {
    stackRoots[(ulong)local_40c - 1] = (RecyclerTestObject *)0x0;
    LVar1 = Location::Scanned(stackRoots + ((ulong)local_40c - 1));
    value._12_4_ = 0;
    value.location = (RecyclerTestObject **)SUB128(LVar1._0_12_,0);
    value.type = SUB124(LVar1._0_12_,8);
    WeightedTable<Location>::AddWeightedEntry(&roots,value,1);
  }
  for (local_434 = 0; local_434 < 0x32; local_434 = local_434 + 1) {
    globalRoots[local_434] = (RecyclerTestObject *)0x0;
    LVar1 = Location::Rooted(globalRoots + local_434);
    value_00._12_4_ = 0;
    value_00.location = (RecyclerTestObject **)SUB128(LVar1._0_12_,0);
    value_00.type = SUB124(LVar1._0_12_,8);
    WeightedTable<Location>::AddWeightedEntry(&roots,value_00,1);
  }
  if ((implicitRootsMode & 1U) != 0) {
    for (local_45c = 0; local_45c < 0x32; local_45c = local_45c + 1) {
      implicitRoots[local_45c] = (RecyclerTestObject *)0x0;
      LVar1 = Location::ImplicitRoot(implicitRoots + local_45c);
      value_01._12_4_ = 0;
      value_01.location = (RecyclerTestObject **)SUB128(LVar1._0_12_,0);
      value_01.type = SUB124(LVar1._0_12_,8);
      WeightedTable<Location>::AddWeightedEntry(&roots,value_01,1);
    }
  }
  for (uStack_484 = 0; uStack_484 < 10000; uStack_484 = uStack_484 + 1) {
    InsertObject();
  }
  PAL_wprintf(L"Initialization complete\n");
  WalkHeap();
  do {
    for (local_488 = 0; local_488 < 100000; local_488 = local_488 + 1) {
      DoHeapOperation();
    }
    WalkHeap();
    Memory::Recycler::FinishDisposeObjectsNow<(Memory::CollectionFlags)32768>(recyclerInstance);
  } while( true );
}

Assistant:

void SimpleRecyclerTest()
{
    // Initialize the probability tables for object creation and heap operations.
    BuildObjectCreationTable();
    BuildOperationTable();

    // Construct Recycler instance and use it
#if ENABLE_BACKGROUND_PAGE_FREEING
    PageAllocator::BackgroundPageQueue backgroundPageQueue;
#endif
    IdleDecommitPageAllocator pageAllocator(nullptr, 
        PageAllocatorType::PageAllocatorType_Thread,
        Js::Configuration::Global.flags,
        0 /* maxFreePageCount */, PageAllocator::DefaultMaxFreePageCount /* maxIdleFreePageCount */,
        false /* zero pages */
#if ENABLE_BACKGROUND_PAGE_FREEING
        , &backgroundPageQueue
#endif
        );

    try
    {
#ifdef EXCEPTION_CHECK
        // REVIEW: Do we need a stack probe here? We don't care about OOM's since we deal with that below
        AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_DisableCheck);
#endif

        recyclerInstance = HeapNewZ(Recycler, nullptr, &pageAllocator, Js::Throw::OutOfMemory, Js::Configuration::Global.flags, nullptr);

        recyclerInstance->Initialize(false /* forceInThread */, nullptr /* threadService */);

#if FALSE
        // TODO: Support EnableImplicitRoots call on Recycler (or similar, e.g. constructor param)
        // Until then, implicitRootsMode support doesn't actually work.
        if (implicitRootsMode)
        {
            recycler->EnableImplicitRoots();
        }
#endif

        wprintf(_u("Recycler created, initializing heap...\n"));
        
        // Initialize stack roots and add to our roots table        
        RecyclerTestObject * stackRoots[stackRootCount];
        for (unsigned int i = 0; i < stackRootCount; i++)
        {
            stackRoots[i] = nullptr;
            roots.AddWeightedEntry(Location::Scanned(&stackRoots[i]), 1);
        }

        // Initialize global roots and add to our roots table        
        for (unsigned int i = 0; i < globalRootCount; i++)
        {
            globalRoots[i] = nullptr;
            roots.AddWeightedEntry(Location::Rooted(&globalRoots[i]), 1);
        }

        // MemProtect only:
        // Initialize implicit roots and add to our roots table        
        if (implicitRootsMode)
        {
            for (unsigned int i = 0; i < implicitRootCount; i++)
            {
                implicitRoots[i] = nullptr;
                roots.AddWeightedEntry(Location::ImplicitRoot(&implicitRoots[i]), 1);
            }
        }
        
        // Initialize GC heap randomly
        for (unsigned int i = 0; i < initializeCount; i++)
        {
            InsertObject();
        }

        wprintf(_u("Initialization complete\n"));

        // Do an initial walk
        WalkHeap();

        // Loop, continually doing heap operations, and periodically doing a full heap walk
        while (true)
        {
            for (unsigned int i = 0; i < operationsPerHeapWalk; i++)
            {
                DoHeapOperation();
            }
            
            WalkHeap();

            // Dispose now
            recyclerInstance->FinishDisposeObjectsNow<FinishDispose>();
        }
    }
    catch (Js::OutOfMemoryException)
    {
        printf("Error: OOM\n");
    }

    wprintf(_u("==== Test completed.\n"));
}